

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O0

ssize_t __thiscall
udpdiscovery::impl::PeerEnv::send(PeerEnv *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t application_id;
  int iVar3;
  uint __hostlong;
  uint32_t uVar4;
  void *__buf_00;
  size_t __n_00;
  ssize_t sVar5;
  undefined1 auStack_c8 [8];
  sockaddr_in addr;
  string local_a8 [8];
  string packet_data;
  undefined1 local_78 [8];
  Packet packet;
  string user_data;
  PacketType packet_type_local;
  ProtocolVersion protocol_version_local;
  bool under_lock_local;
  PeerEnv *this_local;
  
  if ((__fd & 1U) == 0) {
    MinimalisticMutex::Lock(&this->lock_);
  }
  std::__cxx11::string::string((string *)&packet.field_0x30,(string *)&this->user_data_);
  if ((__fd & 1U) == 0) {
    MinimalisticMutex::Unlock(&this->lock_);
  }
  Packet::Packet((Packet *)local_78);
  Packet::set_packet_type((Packet *)local_78,(PacketType)__n);
  application_id = PeerParameters::application_id(&this->parameters_);
  Packet::set_application_id((Packet *)local_78,application_id);
  Packet::set_peer_id((Packet *)local_78,this->peer_id_);
  Packet::set_snapshot_index((Packet *)local_78,this->packet_index_);
  Packet::SwapUserData((Packet *)local_78,(string *)&packet.field_0x30);
  this->packet_index_ = this->packet_index_ + 1;
  std::__cxx11::string::string(local_a8);
  bVar1 = Packet::Serialize((Packet *)local_78,(ProtocolVersion)__buf,(string *)local_a8);
  if (bVar1) {
    auStack_c8._0_2_ = 0;
    auStack_c8[2] = '\0';
    auStack_c8[3] = '\0';
    auStack_c8[4] = '\0';
    auStack_c8[5] = '\0';
    auStack_c8[6] = '\0';
    auStack_c8[7] = '\0';
    addr.sin_family = 0;
    addr.sin_port = 0;
    addr.sin_addr.s_addr = 0;
    bVar1 = PeerParameters::can_use_broadcast(&this->parameters_);
    if (bVar1) {
      auStack_c8._0_2_ = 2;
      iVar3 = PeerParameters::port(&this->parameters_);
      uVar2 = htons((uint16_t)iVar3);
      auStack_c8._2_2_ = uVar2;
      uVar4 = htonl(0xffffffff);
      auStack_c8._4_4_ = uVar4;
    }
    bVar1 = PeerParameters::can_use_multicast(&this->parameters_);
    if (bVar1) {
      auStack_c8._0_2_ = 2;
      iVar3 = PeerParameters::port(&this->parameters_);
      uVar2 = htons((uint16_t)iVar3);
      auStack_c8._2_2_ = uVar2;
      __hostlong = PeerParameters::multicast_group_address(&this->parameters_);
      uVar4 = htonl(__hostlong);
      auStack_c8._4_4_ = uVar4;
    }
    iVar3 = this->sock_;
    __buf_00 = (void *)std::__cxx11::string::data();
    __n_00 = std::__cxx11::string::size();
    sendto(iVar3,__buf_00,__n_00,0,(sockaddr *)auStack_c8,0x10);
  }
  std::__cxx11::string::~string(local_a8);
  Packet::~Packet((Packet *)local_78);
  sVar5 = std::__cxx11::string::~string((string *)&packet.field_0x30);
  return sVar5;
}

Assistant:

void send(bool under_lock, ProtocolVersion protocol_version,
            PacketType packet_type) {
    if (!under_lock) {
      lock_.Lock();
    }
    std::string user_data = user_data_;
    if (!under_lock) {
      lock_.Unlock();
    }

    Packet packet;
    packet.set_packet_type(packet_type);
    packet.set_application_id(parameters_.application_id());
    packet.set_peer_id(peer_id_);
    packet.set_snapshot_index(packet_index_);
    packet.SwapUserData(user_data);

    ++packet_index_;

    std::string packet_data;
    if (!packet.Serialize(protocol_version, packet_data)) {
      return;
    }

    sockaddr_in addr;
    memset((char*)&addr, 0, sizeof(sockaddr_in));

    if (parameters_.can_use_broadcast()) {
      addr.sin_family = AF_INET;
      addr.sin_port = htons(parameters_.port());
      addr.sin_addr.s_addr = htonl(INADDR_BROADCAST);
    }

    if (parameters_.can_use_multicast()) {
      addr.sin_family = AF_INET;
      addr.sin_port = htons(parameters_.port());
      addr.sin_addr.s_addr = htonl(parameters_.multicast_group_address());
    }

    sendto(sock_, packet_data.data(), packet_data.size(), 0,
           (struct sockaddr*)&addr, sizeof(sockaddr_in));
  }